

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O3

void slang::ast::getHierarchicalPathImpl(Symbol *symbol,FormatBuffer *buffer)

{
  char cVar1;
  byte bVar2;
  SymbolKind SVar3;
  int iVar4;
  Symbol *symbol_00;
  char *begin;
  SVInt *this;
  Compilation *pCVar5;
  bool bVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  Scope *pSVar10;
  size_t sVar11;
  size_t sVar12;
  size_type sVar13;
  long lVar14;
  char *begin_00;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  SmallVector<slang::ConstantRange,_8UL> instanceDimVec;
  undefined1 local_a8 [24];
  char local_90 [72];
  char *local_48;
  size_t local_40;
  
  pSVar10 = symbol->parentScope;
  if (pSVar10 == (Scope *)0x0 || symbol->kind != InstanceBody) {
    if (pSVar10 != (Scope *)0x0) {
      if (symbol->kind == CheckerInstanceBody) goto LAB_00348be8;
      goto LAB_00348bf5;
    }
LAB_00348c08:
    bVar6 = true;
    begin_00 = (char *)0x0;
    lVar14 = 0;
  }
  else {
LAB_00348be8:
    symbol = (Symbol *)symbol[1].originatingSyntax;
    pSVar10 = (((GenerateBlockArraySymbol *)symbol)->super_Symbol).parentScope;
    if (pSVar10 == (Scope *)0x0) goto LAB_00348c08;
LAB_00348bf5:
    symbol_00 = pSVar10->thisSym;
    if ((symbol_00->kind | Definition) == CompilationUnit) goto LAB_00348c08;
    getHierarchicalPathImpl(symbol_00,buffer);
    if (((ulong)symbol_00->kind < 0x33) &&
       ((0x4000000c00000U >> ((ulong)symbol_00->kind & 0x3f) & 1) != 0)) {
      lVar14 = 2;
      begin_00 = "::";
    }
    else {
      lVar14 = 1;
      begin_00 = ".";
    }
    bVar6 = false;
  }
  sVar12 = (((GenerateBlockArraySymbol *)symbol)->super_Symbol).name._M_len;
  if (sVar12 != 0) {
    begin = (((GenerateBlockArraySymbol *)symbol)->super_Symbol).name._M_str;
    if (!bVar6) {
      ::fmt::v11::detail::buffer<char>::append<char>
                ((buffer<char> *)buffer,begin_00,begin_00 + lVar14);
    }
    cVar1 = *begin;
    if ((byte)(cVar1 + 0x9fU) < 0x1a || (byte)(cVar1 - 0x30U) < 10) {
      if (9 < (byte)(cVar1 - 0x30U)) {
LAB_00348c98:
        if (sVar12 != 1) {
          sVar11 = 1;
          do {
            bVar2 = begin[sVar11];
            if ((((9 < (byte)(bVar2 - 0x30)) && (0x19 < (byte)((bVar2 & 0xdf) + 0xbf))) &&
                (bVar2 != 0x5f)) && (bVar2 != 0x24)) goto LAB_00348c6c;
            sVar11 = sVar11 + 1;
          } while (sVar12 != sVar11);
        }
        ::fmt::v11::detail::buffer<char>::append<char>((buffer<char> *)buffer,begin,begin + sVar12);
        goto LAB_00348ce4;
      }
    }
    else if (cVar1 == '_' || 0xe5 < (byte)(cVar1 + 0xa5U)) goto LAB_00348c98;
LAB_00348c6c:
    fmt.size_ = 4;
    fmt.data_ = "\\{} ";
    args.field_1.values_ = (value<fmt::v11::context> *)local_a8;
    args.desc_ = 0xd;
    local_a8._0_8_ = begin;
    local_a8._8_8_ = sVar12;
    ::fmt::v11::detail::vformat_to((buffer<char> *)buffer,fmt,args,(locale_ref)0x0);
  }
LAB_00348ce4:
  SVar3 = (((GenerateBlockArraySymbol *)symbol)->super_Symbol).kind;
  if (0x37 < (int)SVar3) {
    if (SVar3 == CheckerInstance) goto LAB_00348e15;
    if (SVar3 != GenerateBlockArray) {
      return;
    }
    if ((((GenerateBlockArraySymbol *)symbol)->super_Symbol).name._M_len != 0) {
      return;
    }
    GenerateBlockArraySymbol::getExternalName_abi_cxx11_
              ((string *)local_a8,(GenerateBlockArraySymbol *)symbol);
    uVar8 = local_a8._8_8_;
    uVar7 = local_a8._0_8_;
    if (!bVar6) {
      ::fmt::v11::detail::buffer<char>::append<char>
                ((buffer<char> *)buffer,begin_00,begin_00 + lVar14);
    }
    if (uVar8 == 0) {
LAB_00349002:
      ::fmt::v11::detail::buffer<char>::append<char>
                ((buffer<char> *)buffer,(char *)uVar7,(char *)(uVar7 + uVar8));
    }
    else {
      cVar1 = *(char *)uVar7;
      if ((byte)(cVar1 + 0x9fU) < 0x1a || (byte)(cVar1 - 0x30U) < 10) {
        if (9 < (byte)(cVar1 - 0x30U)) {
LAB_00348fc8:
          if (uVar8 != 1) {
            sVar12 = 1;
            do {
              bVar2 = *(byte *)(uVar7 + sVar12);
              if (((9 < (byte)(bVar2 - 0x30)) && (0x19 < (byte)((bVar2 & 0xdf) + 0xbf))) &&
                 ((bVar2 != 0x5f && (bVar2 != 0x24)))) goto LAB_00348f99;
              sVar12 = sVar12 + 1;
            } while (uVar8 != sVar12);
          }
          goto LAB_00349002;
        }
      }
      else if (cVar1 == '_' || 0xe5 < (byte)(cVar1 + 0xa5U)) goto LAB_00348fc8;
LAB_00348f99:
      local_48 = (char *)uVar7;
      local_40 = uVar8;
      fmt_01.size_ = 4;
      fmt_01.data_ = "\\{} ";
      args_01.field_1.values_ = (value<fmt::v11::context> *)&local_48;
      args_01.desc_ = 0xd;
      ::fmt::v11::detail::vformat_to((buffer<char> *)buffer,fmt_01,args_01,(locale_ref)0x0);
    }
    goto LAB_003490a5;
  }
  if (SVar3 == Instance) {
LAB_00348e15:
    if ((((GenerateBlockArraySymbol *)symbol)->super_Scope).thisSym == (Symbol *)0x0) {
      return;
    }
    local_a8._0_8_ = local_90;
    local_a8._8_8_ = 0;
    local_a8._16_8_ = 8;
    InstanceSymbolBase::getArrayDimensions
              ((InstanceSymbolBase *)symbol,(SmallVectorBase<slang::ConstantRange> *)local_a8);
    uVar8 = local_a8._8_8_;
    uVar7 = local_a8._0_8_;
    if (local_a8._8_8_ != 0) {
      pCVar5 = (((GenerateBlockArraySymbol *)symbol)->super_Scope).compilation;
      sVar13 = 0;
      do {
        iVar9 = *(int *)(uVar7 + sVar13 * 8);
        iVar4 = *(int *)(uVar7 + sVar13 * 8 + 4);
        if (iVar4 < iVar9) {
          iVar9 = iVar4;
        }
        local_48 = (char *)(ulong)(uint)(iVar9 + *(int *)((long)&(pCVar5->super_BumpAllocator).head
                                                         + sVar13 * 4));
        fmt_00.size_ = 4;
        fmt_00.data_ = "[{}]";
        args_00.field_1.values_ = (value<fmt::v11::context> *)&local_48;
        args_00.desc_ = 1;
        ::fmt::v11::detail::vformat_to((buffer<char> *)buffer,fmt_00,args_00,(locale_ref)0x0);
        sVar13 = sVar13 + 1;
      } while (uVar8 != sVar13);
    }
    if ((char *)local_a8._0_8_ == local_90) {
      return;
    }
    operator_delete((void *)local_a8._0_8_);
    return;
  }
  if (SVar3 != GenerateBlock) {
    return;
  }
  this = (SVInt *)(((GenerateBlockArraySymbol *)symbol)->entries)._M_extent._M_extent_value;
  if (this != (SVInt *)0x0) {
    ::fmt::v11::detail::buffer<char>::append<char>((buffer<char> *)buffer,"[","");
    SVInt::toString_abi_cxx11_((string *)local_a8,this,Decimal,false,0xffffff);
    ::fmt::v11::detail::buffer<char>::append<char>
              ((buffer<char> *)buffer,(char *)local_a8._0_8_,
               (char *)(local_a8._0_8_ + local_a8._8_8_));
    if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
      operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
    }
    ::fmt::v11::detail::buffer<char>::append<char>((buffer<char> *)buffer,"]","");
    return;
  }
  if ((((GenerateBlockArraySymbol *)symbol)->super_Symbol).name._M_len != 0) {
    return;
  }
  GenerateBlockSymbol::getExternalName_abi_cxx11_((string *)local_a8,(GenerateBlockSymbol *)symbol);
  uVar8 = local_a8._8_8_;
  uVar7 = local_a8._0_8_;
  if (!bVar6) {
    ::fmt::v11::detail::buffer<char>::append<char>
              ((buffer<char> *)buffer,begin_00,begin_00 + lVar14);
  }
  if (uVar8 == 0) {
LAB_00349092:
    ::fmt::v11::detail::buffer<char>::append<char>
              ((buffer<char> *)buffer,(char *)uVar7,(char *)(uVar7 + uVar8));
  }
  else {
    cVar1 = *(char *)uVar7;
    if ((byte)(cVar1 + 0x9fU) < 0x1a || (byte)(cVar1 - 0x30U) < 10) {
      if (9 < (byte)(cVar1 - 0x30U)) {
LAB_00349058:
        if (uVar8 != 1) {
          sVar12 = 1;
          do {
            bVar2 = *(byte *)(uVar7 + sVar12);
            if (((9 < (byte)(bVar2 - 0x30)) && (0x19 < (byte)((bVar2 & 0xdf) + 0xbf))) &&
               ((bVar2 != 0x5f && (bVar2 != 0x24)))) goto LAB_0034902c;
            sVar12 = sVar12 + 1;
          } while (uVar8 != sVar12);
        }
        goto LAB_00349092;
      }
    }
    else if (cVar1 == '_' || 0xe5 < (byte)(cVar1 + 0xa5U)) goto LAB_00349058;
LAB_0034902c:
    local_48 = (char *)uVar7;
    local_40 = uVar8;
    fmt_02.size_ = 4;
    fmt_02.data_ = "\\{} ";
    args_02.field_1.values_ = (value<fmt::v11::context> *)&local_48;
    args_02.desc_ = 0xd;
    ::fmt::v11::detail::vformat_to((buffer<char> *)buffer,fmt_02,args_02,(locale_ref)0x0);
  }
LAB_003490a5:
  if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  return;
}

Assistant:

static void getHierarchicalPathImpl(const Symbol& symbol, FormatBuffer& buffer) {
    auto scope = symbol.getParentScope();
    auto current = &symbol;
    if (scope && symbol.kind == SymbolKind::InstanceBody) {
        current = symbol.as<InstanceBodySymbol>().parentInstance;
        SLANG_ASSERT(current);

        scope = current->getParentScope();
    }
    else if (scope && symbol.kind == SymbolKind::CheckerInstanceBody) {
        current = symbol.as<CheckerInstanceBodySymbol>().parentInstance;
        SLANG_ASSERT(current);

        scope = current->getParentScope();
    }

    std::string_view separator;
    if (scope) {
        auto& parent = scope->asSymbol();
        if (parent.kind != SymbolKind::Root && parent.kind != SymbolKind::CompilationUnit) {
            getHierarchicalPathImpl(parent, buffer);
            if (parent.kind == SymbolKind::Package || parent.kind == SymbolKind::ClassType ||
                parent.kind == SymbolKind::CovergroupType) {
                separator = "::"sv;
            }
            else {
                separator = "."sv;
            }
        }
    }

    auto needsEscaping = [](std::string_view text) {
        if (!text.empty()) {
            if (!isValidCIdChar(text[0]) || isDecimalDigit(text[0]))
                return true;

            for (size_t i = 1; i < text.length(); i++) {
                if (!isValidCIdChar(text[i]) && text[i] != '$')
                    return true;
            }
        }
        return false;
    };

    auto addName = [&](std::string_view text) {
        if (!separator.empty())
            buffer.append(separator);

        // If the name requires escaping add that here.
        if (needsEscaping(text))
            buffer.format("\\{} ", text);
        else
            buffer.append(text);
    };

    if (!current->name.empty())
        addName(current->name);

    if (current->kind == SymbolKind::GenerateBlockArray) {
        auto& array = current->as<GenerateBlockArraySymbol>();
        if (current->name.empty())
            addName(array.getExternalName());
    }
    else if (current->kind == SymbolKind::GenerateBlock) {
        auto& block = current->as<GenerateBlockSymbol>();
        if (auto index = block.arrayIndex) {
            buffer.append("[");
            buffer.append(index->toString(LiteralBase::Decimal, false));
            buffer.append("]");
        }
        else if (current->name.empty()) {
            addName(block.getExternalName());
        }
    }
    else if (current->kind == SymbolKind::Instance ||
             current->kind == SymbolKind::CheckerInstance) {
        auto& inst = current->as<InstanceSymbolBase>();
        if (!inst.arrayPath.empty()) {
            SmallVector<ConstantRange, 8> instanceDimVec;
            inst.getArrayDimensions(instanceDimVec);

            std::span<const ConstantRange> instanceDims = instanceDimVec;
            std::span<const uint32_t> arrayPath = inst.arrayPath;
            SLANG_ASSERT(instanceDims.size() == arrayPath.size());

            for (size_t i = 0; i < instanceDims.size(); i++)
                buffer.format("[{}]", int32_t(arrayPath[i]) + instanceDims[i].lower());
        }
    }
}